

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_memory_usage.cpp
# Opt level: O2

void KokkosTools::MemoryUsage::kokkosp_finalize_library(void)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  char *__name;
  char *__s;
  FILE *__stream;
  long lVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  __name = (char *)malloc(0x100);
  gethostname(__name,0x100);
  uVar3 = getpid();
  for (lVar7 = 0; lVar7 < num_spaces; lVar7 = lVar7 + 1) {
    __s = (char *)malloc(0x100);
    uVar6 = 0;
    snprintf(__s,0x100,"%s-%d-%s.memspace_usage",__name,(ulong)uVar3,space_name + lVar7 * 0x40);
    __stream = fopen(__s,"wb");
    free(__s);
    fprintf(__stream,"# Space %s\n",space_name + lVar7 * 0x40);
    fwrite("# Time(s)  Size(MB)   HighWater(MB)   HighWater-Process(MB)\n",0x3c,1,__stream);
    uVar4 = 0;
    while( true ) {
      lVar1 = *(long *)(space_size_track + lVar7 * 0x18);
      if ((ulong)((*(long *)(space_size_track + lVar7 * 0x18 + 8) - lVar1) / 0x18) <= (ulong)uVar4)
      break;
      lVar5 = (ulong)uVar4 * 0x18;
      uVar2 = *(ulong *)(lVar1 + 8 + lVar5);
      if (uVar6 < uVar2) {
        uVar6 = uVar2;
      }
      auVar8._8_4_ = (int)(uVar2 >> 0x20);
      auVar8._0_8_ = uVar2;
      auVar8._12_4_ = 0x45300000;
      auVar9._8_4_ = (int)(uVar6 >> 0x20);
      auVar9._0_8_ = uVar6;
      auVar9._12_4_ = 0x45300000;
      fprintf(__stream,"%lf %.1lf %.1lf %.1lf\n",*(undefined8 *)(lVar1 + 0x10 + lVar5),
              ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 0.0009765625 *
              0.0009765625,
              ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 0.0009765625 *
              0.0009765625,*(double *)(lVar1 + lVar5) * 0.0009765625 * 0.0009765625);
      uVar4 = uVar4 + 1;
    }
    fclose(__stream);
  }
  free(__name);
  return;
}

Assistant:

void kokkosp_finalize_library() {
  char* hostname = (char*)malloc(sizeof(char) * 256);
  gethostname(hostname, 256);
  int pid = getpid();

  for (int s = 0; s < num_spaces; s++) {
    char* fileOutput = (char*)malloc(sizeof(char) * 256);
    snprintf(fileOutput, 256, "%s-%d-%s.memspace_usage", hostname, pid,
             space_name[s]);

    FILE* ofile = fopen(fileOutput, "wb");
    free(fileOutput);

    fprintf(ofile, "# Space %s\n", space_name[s]);
    fprintf(ofile,
            "# Time(s)  Size(MB)   HighWater(MB)   HighWater-Process(MB)\n");
    uint64_t maxvalue = 0;
    for (unsigned int i = 0; i < space_size_track[s].size(); i++) {
      if (std::get<1>(space_size_track[s][i]) > maxvalue)
        maxvalue = std::get<1>(space_size_track[s][i]);
      fprintf(ofile, "%lf %.1lf %.1lf %.1lf\n",
              std::get<0>(space_size_track[s][i]),
              1.0 * std::get<1>(space_size_track[s][i]) / 1024 / 1024,
              1.0 * maxvalue / 1024 / 1024,
              1.0 * std::get<2>(space_size_track[s][i]) / 1024 / 1024);
    }
    fclose(ofile);
  }
  free(hostname);
}